

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O2

uint lodepng_encode(uchar **out,size_t *outsize,uchar *image,uint w,uint h,LodePNGState *state)

{
  LodePNGEncoderSettings *settings;
  uchar uVar1;
  char *pcVar2;
  byte bVar3;
  bool bVar7;
  bool bVar8;
  char **ppcVar9;
  uint uVar10;
  int iVar11;
  LodePNGColorType LVar12;
  uchar *puVar13;
  size_t sVar14;
  size_t sVar15;
  uchar uVar16;
  uchar uVar17;
  uchar uVar18;
  uint b;
  long lVar19;
  ulong uVar20;
  uint *puVar21;
  size_t sVar22;
  uchar *puVar23;
  uchar *in;
  ushort uVar24;
  ushort uVar25;
  ushort uVar26;
  size_t local_1e0;
  ucvector bKGD;
  ucvector outv;
  uchar *data;
  undefined1 local_188 [16];
  undefined8 local_178;
  size_t local_168;
  uchar *local_160;
  char **local_158;
  size_t datasize;
  size_t *local_148;
  char **local_140;
  char **local_138;
  char **local_130;
  char **local_128;
  uchar **local_120;
  LodePNGInfo info;
  byte bVar4;
  byte bVar5;
  byte bVar6;
  
  data = (uchar *)0x0;
  datasize = 0;
  *out = (uchar *)0x0;
  *outsize = 0;
  state->error = 0;
  local_120 = out;
  lodepng_info_init(&info);
  lodepng_info_copy(&info,&state->info_png);
  if (((info.color.colortype == LCT_PALETTE) || ((state->encoder).force_palette != 0)) &&
     (info.color.palettesize - 0x101 < 0xffffffffffffff00)) {
    state->error = 0x44;
    return 0x44;
  }
  if ((state->encoder).auto_convert == 0) {
    uVar10 = state->error;
  }
  else {
    uVar10 = lodepng_auto_choose_color(&info.color,image,w,h,&state->info_raw);
    state->error = uVar10;
  }
  if (uVar10 != 0) {
    return uVar10;
  }
  settings = &state->encoder;
  if (2 < (settings->zlibsettings).btype) {
    state->error = 0x3d;
    return 0x3d;
  }
  if (1 < (state->info_png).interlace_method) {
    state->error = 0x47;
    return 0x47;
  }
  uVar10 = checkColorValidity(info.color.colortype,info.color.bitdepth);
  state->error = uVar10;
  if (uVar10 != 0) {
    return uVar10;
  }
  uVar10 = checkColorValidity((state->info_raw).colortype,(state->info_raw).bitdepth);
  state->error = uVar10;
  if (uVar10 != 0) {
    return uVar10;
  }
  iVar11 = lodepng_color_mode_equal(&state->info_raw,&info.color);
  if (iVar11 == 0) {
    uVar10 = lodepng_get_bpp(&info.color);
    lVar19 = (ulong)uVar10 * (ulong)(h * w);
    puVar13 = (uchar *)malloc(lVar19 + 7U >> 3);
    if (lVar19 == 0 || puVar13 != (uchar *)0x0) {
      uVar10 = lodepng_convert(puVar13,image,&info.color,&state->info_raw,w,h);
      state->error = uVar10;
      if (uVar10 == 0) {
        preProcessScanlines(&data,&datasize,puVar13,w,h,&info,settings);
      }
    }
    else {
      state->error = 0x53;
    }
    free(puVar13);
  }
  else {
    preProcessScanlines(&data,&datasize,image,w,h,&info,settings);
  }
  outv.allocsize = 0;
  outv.data = (uchar *)0x0;
  outv.size = 0;
  if (state->error != 0) goto LAB_0010a1b8;
  ucvector_push_back(&outv,0x89);
  ucvector_push_back(&outv,'P');
  ucvector_push_back(&outv,'N');
  ucvector_push_back(&outv,'G');
  ucvector_push_back(&outv,'\r');
  ucvector_push_back(&outv,'\n');
  ucvector_push_back(&outv,'\x1a');
  ucvector_push_back(&outv,'\n');
  uVar16 = (uchar)info.color.colortype;
  bKGD.data = (uchar *)0x0;
  bKGD.size = 0;
  bKGD.allocsize = 0;
  lodepng_add32bitInt(&bKGD,w);
  lodepng_add32bitInt(&bKGD,h);
  ucvector_push_back(&bKGD,(uchar)info.color.bitdepth);
  ucvector_push_back(&bKGD,uVar16);
  ucvector_push_back(&bKGD,'\0');
  ucvector_push_back(&bKGD,'\0');
  ucvector_push_back(&bKGD,(uchar)info.interlace_method);
  addChunk(&outv,"IHDR",bKGD.data,bKGD.size);
  ucvector_cleanup(&bKGD);
  if (info.unknown_chunks_data[0] != (uchar *)0x0) {
    uVar10 = addUnknownChunks(&outv,info.unknown_chunks_data[0],info.unknown_chunks_size[0]);
    state->error = uVar10;
    if (uVar10 != 0) goto LAB_0010a1b8;
  }
  if (info.color.colortype == LCT_PALETTE) {
    addChunk_PLTE(&outv,&info.color);
  }
  if (((state->encoder).force_palette != 0) && ((info.color.colortype & ~LCT_GREY_ALPHA) == LCT_RGB)
     ) {
    addChunk_PLTE(&outv,&info.color);
  }
  LVar12 = info.color.colortype;
  if (info.color.colortype == LCT_PALETTE) {
    bVar7 = false;
    uVar16 = '\0';
    uVar17 = '\0';
    uVar18 = '\0';
    for (sVar22 = 0; sVar22 != info.color.palettesize; sVar22 = sVar22 + 1) {
      lVar19 = sVar22 * 4;
      uVar1 = info.color.palette[sVar22 * 4 + 3];
      bVar8 = true;
      if (bVar7) {
        if ((uVar1 != 0xff) ||
           (((bVar7 = bVar8, uVar16 == info.color.palette[lVar19] &&
             (uVar17 == info.color.palette[lVar19 + 1])) &&
            (uVar18 == info.color.palette[lVar19 + 2])))) goto LAB_0010a41f;
      }
      else {
        bVar7 = false;
        if (uVar1 != 0xff) {
          if (uVar1 != '\0') goto LAB_0010a41f;
          uVar16 = info.color.palette[lVar19];
          uVar17 = info.color.palette[lVar19 + 1];
          uVar18 = info.color.palette[lVar19 + 2];
          sVar22 = 0xffffffffffffffff;
          bVar7 = bVar8;
        }
      }
    }
    if (bVar7) {
LAB_0010a41f:
      addChunk_tRNS(&outv,&info.color);
      LVar12 = info.color.colortype;
    }
    else {
      LVar12 = LCT_PALETTE;
    }
  }
  if (((LVar12 & ~LCT_RGB) == LCT_GREY) && (info.color.key_defined != 0)) {
    addChunk_tRNS(&outv,&info.color);
  }
  if (info.background_defined != 0) {
    bKGD.data = (uchar *)0x0;
    bKGD.size = 0;
    bKGD.allocsize = 0;
    sVar22 = 0;
    puVar13 = (uchar *)0x0;
    if (info.color.colortype < 7) {
      puVar21 = &info.background_r;
      switch(info.color.colortype) {
      default:
        info.background_b._1_1_ = info.background_r._1_1_;
        break;
      case 1:
      case 5:
        goto switchD_0010a4a9_caseD_1;
      case LCT_RGB:
      case LCT_RGBA:
        puVar21 = &info.background_b;
        ucvector_push_back(&bKGD,info.background_r._1_1_);
        info.background_g._0_2_ = info.background_g._1_2_;
        ucvector_push_back(&bKGD,(uchar)(undefined2)info.background_r);
        ucvector_push_back(&bKGD,(uchar)((ushort)(undefined2)info.background_g >> 8));
        ucvector_push_back(&bKGD,(uchar)(undefined2)info.background_g);
        break;
      case LCT_PALETTE:
        goto switchD_0010a4a9_caseD_3;
      }
      ucvector_push_back(&bKGD,info.background_b._1_1_);
switchD_0010a4a9_caseD_3:
      ucvector_push_back(&bKGD,(uchar)*puVar21);
      sVar22 = bKGD.size;
      puVar13 = bKGD.data;
    }
switchD_0010a4a9_caseD_1:
    addChunk(&outv,"bKGD",puVar13,sVar22);
    ucvector_cleanup(&bKGD);
  }
  if (info.phys_defined != 0) {
    bKGD.data = (uchar *)0x0;
    bKGD.size = 0;
    bKGD.allocsize = 0;
    lodepng_add32bitInt(&bKGD,info.phys_x);
    lodepng_add32bitInt(&bKGD,info.phys_y);
    ucvector_push_back(&bKGD,(uchar)info.phys_unit);
    addChunk(&outv,"pHYs",bKGD.data,bKGD.size);
    ucvector_cleanup(&bKGD);
  }
  if (info.unknown_chunks_data[1] != (uchar *)0x0) {
    uVar10 = addUnknownChunks(&outv,info.unknown_chunks_data[1],info.unknown_chunks_size[1]);
    state->error = uVar10;
    if (uVar10 != 0) goto LAB_0010a1b8;
  }
  bKGD.data = (uchar *)0x0;
  bKGD.size = 0;
  bKGD.allocsize = 0;
  uVar10 = zlib_compress(&bKGD.data,&bKGD.size,data,datasize,&settings->zlibsettings);
  if (uVar10 == 0) {
    uVar10 = addChunk(&outv,"IDAT",bKGD.data,bKGD.size);
  }
  ucvector_cleanup(&bKGD);
  state->error = uVar10;
  if (uVar10 == 0) {
    if ((info.time_defined != 0) && (puVar13 = (uchar *)malloc(7), puVar13 != (uchar *)0x0)) {
      uVar24 = (ushort)info.time.month & 0xff;
      uVar25 = (ushort)info.time.day & 0xff;
      uVar26 = (ushort)info.time.hour & 0xff;
      *puVar13 = (uchar)(info.time.year >> 8);
      bVar3 = ((info.time.year & 0xff) != 0) * (((ushort)info.time.year & 0xff) < 0x100) *
              (char)info.time.year - (0xff < ((ushort)info.time.year & 0xff));
      bVar4 = (uVar24 != 0) * (uVar24 < 0x100) * (char)(ushort)info.time.month - (0xff < uVar24);
      bVar5 = (uVar25 != 0) * (uVar25 < 0x100) * (char)(ushort)info.time.day - (0xff < uVar25);
      bVar6 = (uVar26 != 0) * (uVar26 < 0x100) * (char)(ushort)info.time.hour - (0xff < uVar26);
      *(uint *)(puVar13 + 1) =
           CONCAT13((bVar6 != 0) * (bVar6 < 0x100) * bVar6 - (0xff < bVar6),
                    CONCAT12((bVar5 != 0) * (bVar5 < 0x100) * bVar5 - (0xff < bVar5),
                             CONCAT11((bVar4 != 0) * (bVar4 < 0x100) * bVar4 - (0xff < bVar4),
                                      (bVar3 != 0) * (bVar3 < 0x100) * bVar3 - (0xff < bVar3))));
      puVar13[5] = (uchar)info.time.minute;
      puVar13[6] = (uchar)info.time.second;
      addChunk(&outv,"tIME",puVar13,7);
      free(puVar13);
    }
    ppcVar9 = info.text_keys;
    local_1e0 = info.text_num;
    local_158 = info.text_strings;
    for (sVar22 = 0; sVar22 != info.text_num; sVar22 = sVar22 + 1) {
      pcVar2 = ppcVar9[sVar22];
      sVar14 = strlen(pcVar2);
      if (0x4f < sVar14) {
        uVar10 = 0x42;
LAB_0010a859:
        state->error = uVar10;
        sVar22 = local_1e0;
        break;
      }
      if (sVar14 == 0) {
        uVar10 = 0x43;
        goto LAB_0010a859;
      }
      puVar13 = (uchar *)local_158[sVar22];
      if ((state->encoder).text_compression == 0) {
        addChunk_tEXt(&outv,pcVar2,(char *)puVar13);
      }
      else {
        local_160 = puVar13;
        local_168 = strlen((char *)puVar13);
        bKGD.data = (uchar *)0x0;
        bKGD.size = 0;
        bKGD.allocsize = 0;
        local_188 = (undefined1  [16])0x0;
        local_178 = 0;
        for (uVar20 = 0xffffffffffffffb0; pcVar2[uVar20 + 0x50] != '\0'; uVar20 = uVar20 + 1) {
          ucvector_push_back(&bKGD,pcVar2[uVar20 + 0x50]);
        }
        if (0xffffffffffffffb0 < uVar20) {
          ucvector_push_back(&bKGD,'\0');
          ucvector_push_back(&bKGD,'\0');
          uVar10 = zlib_compress((uchar **)local_188,(size_t *)(local_188 + 8),local_160,local_168,
                                 &settings->zlibsettings);
          if (uVar10 == 0) {
            for (lVar19 = 0; lVar19 != local_188._8_8_; lVar19 = lVar19 + 1) {
              ucvector_push_back(&bKGD,*(uchar *)(local_188._0_8_ + lVar19));
            }
            addChunk(&outv,"zTXt",bKGD.data,bKGD.size);
          }
          ucvector_cleanup(local_188);
          ucvector_cleanup(&bKGD);
        }
      }
    }
    local_1e0 = sVar22;
    if ((state->encoder).add_id != 0) {
      sVar22 = 0;
      do {
        if (local_1e0 == sVar22) {
          addChunk_tEXt(&outv,"LodePNG",LODEPNG_VERSION_STRING);
          break;
        }
        iVar11 = strcmp(info.text_keys[sVar22],"LodePNG");
        sVar22 = sVar22 + 1;
      } while (iVar11 != 0);
    }
    local_168 = info.itext_num;
    local_128 = info.itext_keys;
    local_130 = info.itext_langtags;
    local_138 = info.itext_transkeys;
    local_140 = info.itext_strings;
    local_148 = outsize;
    for (sVar14 = 0; uVar10 = 0x42, sVar14 != local_168; sVar14 = sVar14 + 1) {
      pcVar2 = local_128[sVar14];
      sVar15 = strlen(pcVar2);
      if (0x4f < sVar15) {
LAB_0010ab03:
        state->error = uVar10;
        break;
      }
      if (sVar15 == 0) {
        uVar10 = 0x43;
        goto LAB_0010ab03;
      }
      local_158 = (char **)CONCAT44(local_158._4_4_,(state->encoder).text_compression);
      puVar13 = (uchar *)local_130[sVar14];
      puVar23 = (uchar *)local_138[sVar14];
      in = (uchar *)local_140[sVar14];
      local_160 = (uchar *)strlen((char *)in);
      bKGD.data = (uchar *)0x0;
      bKGD.size = 0;
      bKGD.allocsize = 0;
      for (uVar20 = 0xffffffffffffffb0; uVar16 = pcVar2[uVar20 + 0x50], uVar16 != '\0';
          uVar20 = uVar20 + 1) {
        ucvector_push_back(&bKGD,uVar16);
      }
      if (0xffffffffffffffb0 < uVar20) {
        ucvector_push_back(&bKGD,'\0');
        iVar11 = (int)local_158;
        ucvector_push_back(&bKGD,(int)local_158 != 0);
        ucvector_push_back(&bKGD,'\0');
        for (; *puVar13 != '\0'; puVar13 = puVar13 + 1) {
          ucvector_push_back(&bKGD,*puVar13);
        }
        ucvector_push_back(&bKGD,'\0');
        for (; *puVar23 != '\0'; puVar23 = puVar23 + 1) {
          ucvector_push_back(&bKGD,*puVar23);
        }
        ucvector_push_back(&bKGD,'\0');
        if (iVar11 == 0) {
          for (; *in != '\0'; in = in + 1) {
            ucvector_push_back(&bKGD,*in);
          }
LAB_0010aad0:
          addChunk(&outv,"iTXt",bKGD.data,bKGD.size);
        }
        else {
          local_188 = (undefined1  [16])0x0;
          local_178 = 0;
          uVar10 = zlib_compress((uchar **)local_188,(size_t *)(local_188 + 8),in,(size_t)local_160,
                                 &settings->zlibsettings);
          if (uVar10 == 0) {
            for (lVar19 = 0; lVar19 != local_188._8_8_; lVar19 = lVar19 + 1) {
              ucvector_push_back(&bKGD,*(uchar *)(local_188._0_8_ + lVar19));
            }
            ucvector_cleanup(local_188);
            goto LAB_0010aad0;
          }
          ucvector_cleanup(local_188);
        }
        ucvector_cleanup(&bKGD);
      }
    }
    outsize = local_148;
    if (info.unknown_chunks_data[2] != (uchar *)0x0) {
      uVar10 = addUnknownChunks(&outv,info.unknown_chunks_data[2],info.unknown_chunks_size[2]);
      state->error = uVar10;
      if (uVar10 != 0) goto LAB_0010a1b8;
    }
    addChunk(&outv,"IEND",(uchar *)0x0,0);
  }
LAB_0010a1b8:
  lodepng_info_cleanup(&info);
  free(data);
  *local_120 = outv.data;
  *outsize = outv.size;
  return state->error;
}

Assistant:

unsigned lodepng_encode(unsigned char** out, size_t* outsize,
                        const unsigned char* image, unsigned w, unsigned h,
                        LodePNGState* state)
{
  LodePNGInfo info;
  ucvector outv;
  unsigned char* data = 0; /*uncompressed version of the IDAT chunk data*/
  size_t datasize = 0;

  /*provide some proper output values if error will happen*/
  *out = 0;
  *outsize = 0;
  state->error = 0;

  lodepng_info_init(&info);
  lodepng_info_copy(&info, &state->info_png);

  if((info.color.colortype == LCT_PALETTE || state->encoder.force_palette)
      && (info.color.palettesize == 0 || info.color.palettesize > 256))
  {
    state->error = 68; /*invalid palette size, it is only allowed to be 1-256*/
    return state->error;
  }

  if(state->encoder.auto_convert)
  {
    state->error = lodepng_auto_choose_color(&info.color, image, w, h, &state->info_raw);
  }
  if(state->error) return state->error;

  if(state->encoder.zlibsettings.btype > 2)
  {
    CERROR_RETURN_ERROR(state->error, 61); /*error: unexisting btype*/
  }
  if(state->info_png.interlace_method > 1)
  {
    CERROR_RETURN_ERROR(state->error, 71); /*error: unexisting interlace mode*/
  }

  state->error = checkColorValidity(info.color.colortype, info.color.bitdepth);
  if(state->error) return state->error; /*error: unexisting color type given*/
  state->error = checkColorValidity(state->info_raw.colortype, state->info_raw.bitdepth);
  if(state->error) return state->error; /*error: unexisting color type given*/

  if(!lodepng_color_mode_equal(&state->info_raw, &info.color))
  {
    unsigned char* converted;
    size_t size = (w * h * (size_t)lodepng_get_bpp(&info.color) + 7) / 8;

    converted = (unsigned char*)lodepng_malloc(size);
    if(!converted && size) state->error = 83; /*alloc fail*/
    if(!state->error)
    {
      state->error = lodepng_convert(converted, image, &info.color, &state->info_raw, w, h);
    }
    if(!state->error) preProcessScanlines(&data, &datasize, converted, w, h, &info, &state->encoder);
    lodepng_free(converted);
  }
  else preProcessScanlines(&data, &datasize, image, w, h, &info, &state->encoder);

  ucvector_init(&outv);
  while(!state->error) /*while only executed once, to break on error*/
  {
#ifdef LODEPNG_COMPILE_ANCILLARY_CHUNKS
    size_t i;
#endif /*LODEPNG_COMPILE_ANCILLARY_CHUNKS*/
    /*write signature and chunks*/
    writeSignature(&outv);
    /*IHDR*/
    addChunk_IHDR(&outv, w, h, info.color.colortype, info.color.bitdepth, info.interlace_method);
#ifdef LODEPNG_COMPILE_ANCILLARY_CHUNKS
    /*unknown chunks between IHDR and PLTE*/
    if(info.unknown_chunks_data[0])
    {
      state->error = addUnknownChunks(&outv, info.unknown_chunks_data[0], info.unknown_chunks_size[0]);
      if(state->error) break;
    }
#endif /*LODEPNG_COMPILE_ANCILLARY_CHUNKS*/
    /*PLTE*/
    if(info.color.colortype == LCT_PALETTE)
    {
      addChunk_PLTE(&outv, &info.color);
    }
    if(state->encoder.force_palette && (info.color.colortype == LCT_RGB || info.color.colortype == LCT_RGBA))
    {
      addChunk_PLTE(&outv, &info.color);
    }
    /*tRNS*/
    if(info.color.colortype == LCT_PALETTE && getPaletteTranslucency(info.color.palette, info.color.palettesize) != 0)
    {
      addChunk_tRNS(&outv, &info.color);
    }
    if((info.color.colortype == LCT_GREY || info.color.colortype == LCT_RGB) && info.color.key_defined)
    {
      addChunk_tRNS(&outv, &info.color);
    }
#ifdef LODEPNG_COMPILE_ANCILLARY_CHUNKS
    /*bKGD (must come between PLTE and the IDAt chunks*/
    if(info.background_defined) addChunk_bKGD(&outv, &info);
    /*pHYs (must come before the IDAT chunks)*/
    if(info.phys_defined) addChunk_pHYs(&outv, &info);

    /*unknown chunks between PLTE and IDAT*/
    if(info.unknown_chunks_data[1])
    {
      state->error = addUnknownChunks(&outv, info.unknown_chunks_data[1], info.unknown_chunks_size[1]);
      if(state->error) break;
    }
#endif /*LODEPNG_COMPILE_ANCILLARY_CHUNKS*/
    /*IDAT (multiple IDAT chunks must be consecutive)*/
    state->error = addChunk_IDAT(&outv, data, datasize, &state->encoder.zlibsettings);
    if(state->error) break;
#ifdef LODEPNG_COMPILE_ANCILLARY_CHUNKS
    /*tIME*/
    if(info.time_defined) addChunk_tIME(&outv, &info.time);
    /*tEXt and/or zTXt*/
    for(i = 0; i != info.text_num; ++i)
    {
      if(strlen(info.text_keys[i]) > 79)
      {
        state->error = 66; /*text chunk too large*/
        break;
      }
      if(strlen(info.text_keys[i]) < 1)
      {
        state->error = 67; /*text chunk too small*/
        break;
      }
      if(state->encoder.text_compression)
      {
        addChunk_zTXt(&outv, info.text_keys[i], info.text_strings[i], &state->encoder.zlibsettings);
      }
      else
      {
        addChunk_tEXt(&outv, info.text_keys[i], info.text_strings[i]);
      }
    }
    /*LodePNG version id in text chunk*/
    if(state->encoder.add_id)
    {
      unsigned alread_added_id_text = 0;
      for(i = 0; i != info.text_num; ++i)
      {
        if(!strcmp(info.text_keys[i], "LodePNG"))
        {
          alread_added_id_text = 1;
          break;
        }
      }
      if(alread_added_id_text == 0)
      {
        addChunk_tEXt(&outv, "LodePNG", LODEPNG_VERSION_STRING); /*it's shorter as tEXt than as zTXt chunk*/
      }
    }
    /*iTXt*/
    for(i = 0; i != info.itext_num; ++i)
    {
      if(strlen(info.itext_keys[i]) > 79)
      {
        state->error = 66; /*text chunk too large*/
        break;
      }
      if(strlen(info.itext_keys[i]) < 1)
      {
        state->error = 67; /*text chunk too small*/
        break;
      }
      addChunk_iTXt(&outv, state->encoder.text_compression,
                    info.itext_keys[i], info.itext_langtags[i], info.itext_transkeys[i], info.itext_strings[i],
                    &state->encoder.zlibsettings);
    }

    /*unknown chunks between IDAT and IEND*/
    if(info.unknown_chunks_data[2])
    {
      state->error = addUnknownChunks(&outv, info.unknown_chunks_data[2], info.unknown_chunks_size[2]);
      if(state->error) break;
    }
#endif /*LODEPNG_COMPILE_ANCILLARY_CHUNKS*/
    addChunk_IEND(&outv);

    break; /*this isn't really a while loop; no error happened so break out now!*/
  }

  lodepng_info_cleanup(&info);
  lodepng_free(data);
  /*instead of cleaning the vector up, give it to the output*/
  *out = outv.data;
  *outsize = outv.size;

  return state->error;
}